

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeNeighbouringTriangleMap
          (ChTriangleMeshConnected *this,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  pointer paVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  ulong __new_size;
  size_type sVar10;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var11;
  long lVar12;
  int it;
  ulong uVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar14;
  pair<int,_int> medgeA;
  pair<int,_int> medgeC;
  pair<int,_int> medgeB;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edge_map._M_t._M_impl.super__Rb_tree_header._M_header;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar12 = 8;
  uVar13 = 0;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pCVar4 = (this->m_face_v_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __new_size = ((long)(this->m_face_v_indices).
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0xc;
    if (__new_size <= uVar13) break;
    iVar1 = *(int *)((long)pCVar4->m_data + lVar12 + -8);
    iVar2 = *(int *)((long)pCVar4->m_data + lVar12 + -4);
    iVar3 = *(int *)((long)pCVar4->m_data + lVar12);
    iVar6 = iVar2;
    if (iVar1 < iVar2) {
      iVar6 = iVar1;
    }
    iVar7 = iVar2;
    if (iVar2 < iVar1) {
      iVar7 = iVar1;
    }
    iVar8 = iVar1;
    if (iVar3 < iVar1) {
      iVar8 = iVar3;
    }
    if (iVar1 < iVar3) {
      iVar1 = iVar3;
    }
    medgeA.second = iVar7;
    medgeA.first = iVar6;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&medgeA);
    iVar6 = iVar3;
    if (iVar3 < iVar2) {
      iVar6 = iVar2;
    }
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    medgeA.second = iVar6;
    medgeA.first = iVar3;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&medgeA);
    medgeA.second = iVar1;
    medgeA.first = iVar8;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&medgeA);
    uVar13 = uVar13 + 1;
    lVar12 = lVar12 + 0xc;
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            (tri_map,__new_size);
  uVar13 = 0;
  bVar9 = false;
  do {
    pCVar4 = (this->m_face_v_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_face_v_indices).
                       super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0xc) <= uVar13)
    {
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
      ::~_Rb_tree(&edge_map._M_t);
      return bVar9;
    }
    paVar5 = (tri_map->
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar5[uVar13]._M_elems[0] = (int)uVar13;
    paVar5[uVar13]._M_elems[1] = -1;
    paVar5[uVar13]._M_elems[2] = -1;
    paVar5[uVar13]._M_elems[3] = -1;
    medgeA.first = pCVar4[uVar13].m_data[0];
    iVar1 = pCVar4[uVar13].m_data[1];
    medgeA.second = iVar1;
    iVar2 = pCVar4[uVar13].m_data[2];
    medgeC.second = pCVar4[uVar13].m_data[0];
    if (iVar1 < medgeA.first) {
      medgeA.second = medgeA.first;
      medgeA.first = iVar1;
    }
    medgeB.first = iVar1;
    medgeB.second = iVar2;
    if (iVar2 < iVar1) {
      medgeB.first = iVar2;
      medgeB.second = iVar1;
    }
    medgeC.first = iVar2;
    if (medgeC.second < iVar2) {
      medgeC.first = medgeC.second;
      medgeC.second = iVar2;
    }
    sVar10 = std::
             _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::count(&edge_map._M_t,&medgeA);
    if (sVar10 < 3) {
      sVar10 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::count(&edge_map._M_t,&medgeB);
      if (2 < sVar10) goto LAB_00d59c12;
      sVar10 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::count(&edge_map._M_t,&medgeC);
      if (2 < sVar10) goto LAB_00d59c12;
    }
    else {
LAB_00d59c12:
      bVar9 = true;
    }
    pVar14 = std::
             _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::equal_range(&edge_map._M_t,&medgeA);
    for (_Var11 = pVar14.first._M_node; _Var11._M_node != pVar14.second._M_node._M_node;
        _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
      if (uVar13 != *(uint *)&_Var11._M_node[1]._M_parent) {
        (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems[1] =
             *(uint *)&_Var11._M_node[1]._M_parent;
        break;
      }
    }
    pVar14 = std::
             _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::equal_range(&edge_map._M_t,&medgeB);
    for (_Var11 = pVar14.first._M_node; _Var11._M_node != pVar14.second._M_node._M_node;
        _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
      if (uVar13 != *(uint *)&_Var11._M_node[1]._M_parent) {
        (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems[2] =
             *(uint *)&_Var11._M_node[1]._M_parent;
        break;
      }
    }
    pVar14 = std::
             _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::equal_range(&edge_map._M_t,&medgeC);
    for (_Var11 = pVar14.first._M_node; _Var11._M_node != pVar14.second._M_node._M_node;
        _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
      if (uVar13 != *(uint *)&_Var11._M_node[1]._M_parent) {
        (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems[3] =
             *(uint *)&_Var11._M_node[1]._M_parent;
        break;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool ChTriangleMeshConnected::ComputeNeighbouringTriangleMap(std::vector<std::array<int, 4>>& tri_map) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    // Create a map of neighboring triangles, vector of:
    // [Ti TieA TieB TieC]
    tri_map.resize(this->m_face_v_indices.size());
    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        tri_map[it][0] = it;
        tri_map[it][1] = -1;  // default no neighbour
        tri_map[it][2] = -1;  // default no neighbour
        tri_map[it][3] = -1;  // default no neighbour
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        if (edge_map.count(medgeA) > 2 || edge_map.count(medgeB) > 2 || edge_map.count(medgeC) > 2) {
            pathological_edges = true;
            // GetLog() << "Warning, edge shared with more than two triangles! \n";
        }
        auto retA = edge_map.equal_range(medgeA);
        for (auto fedge = retA.first; fedge != retA.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][1] = fedge->second;
                break;
            }
        }
        auto retB = edge_map.equal_range(medgeB);
        for (auto fedge = retB.first; fedge != retB.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][2] = fedge->second;
                break;
            }
        }
        auto retC = edge_map.equal_range(medgeC);
        for (auto fedge = retC.first; fedge != retC.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][3] = fedge->second;
                break;
            }
        }
    }
    return pathological_edges;
}